

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O0

TestStatus * __thiscall
vkt::api::anon_unknown_1::
multithreadedCreatePerThreadDeviceTest<vkt::api::(anonymous_namespace)::Buffer>
          (TestStatus *__return_storage_ptr__,anon_unknown_1 *this,Context *context,
          Parameters params)

{
  deUint32 maxResourceConsumers_;
  EnvClone *pEVar1;
  reference pvVar2;
  Resources *pRVar3;
  reference pvVar4;
  CreateThread<vkt::api::(anonymous_namespace)::Buffer> *this_00;
  DefaultDeleter<vkt::api::(anonymous_namespace)::ThreadGroupThread> local_129;
  MovePtr<vkt::api::(anonymous_namespace)::ThreadGroupThread,_de::DefaultDeleter<vkt::api::(anonymous_namespace)::ThreadGroupThread>_>
  local_128;
  SharedPtr<vkt::api::(anonymous_namespace)::Buffer::Resources> local_118;
  SharedPtr<vkt::api::(anonymous_namespace)::EnvClone> local_108;
  uint local_f4;
  undefined1 local_f0 [4];
  deUint32 ndx;
  ThreadGroup threads;
  undefined1 local_b8 [8];
  vector<de::SharedPtr<vkt::api::(anonymous_namespace)::Buffer::Resources>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::Buffer::Resources>_>_>
  resources;
  allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::EnvClone>_> local_89;
  undefined1 local_88 [8];
  vector<de::SharedPtr<vkt::api::(anonymous_namespace)::EnvClone>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::EnvClone>_>_>
  perThreadEnv;
  Environment sharedEnv;
  Parameters deviceParams;
  deUint32 numThreads;
  Context *context_local;
  Parameters params_local;
  
  params_local.size._0_4_ = (undefined4)params.size;
  context_local = context;
  params_local._8_8_ = __return_storage_ptr__;
  maxResourceConsumers_ = getDefaultTestThreadCount();
  register0x00000000 = getDefaulDeviceParameters((Context *)this);
  Environment::Environment
            ((Environment *)
             &perThreadEnv.
              super__Vector_base<de::SharedPtr<vkt::api::(anonymous_namespace)::EnvClone>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::EnvClone>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,(Context *)this,
             maxResourceConsumers_);
  std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::EnvClone>_>::allocator(&local_89);
  std::
  vector<de::SharedPtr<vkt::api::(anonymous_namespace)::EnvClone>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::EnvClone>_>_>
  ::vector((vector<de::SharedPtr<vkt::api::(anonymous_namespace)::EnvClone>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::EnvClone>_>_>
            *)local_88,(ulong)maxResourceConsumers_,&local_89);
  std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::EnvClone>_>::~allocator(&local_89);
  std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::Buffer::Resources>_>::allocator
            ((allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::Buffer::Resources>_> *)
             &threads.field_0x2f);
  std::
  vector<de::SharedPtr<vkt::api::(anonymous_namespace)::Buffer::Resources>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::Buffer::Resources>_>_>
  ::vector((vector<de::SharedPtr<vkt::api::(anonymous_namespace)::Buffer::Resources>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::Buffer::Resources>_>_>
            *)local_b8,(ulong)maxResourceConsumers_,(allocator_type *)&threads.field_0x2f);
  std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::Buffer::Resources>_>::~allocator
            ((allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::Buffer::Resources>_> *)
             &threads.field_0x2f);
  ThreadGroup::ThreadGroup((ThreadGroup *)local_f0);
  for (local_f4 = 0; local_f4 < maxResourceConsumers_; local_f4 = local_f4 + 1) {
    pEVar1 = (EnvClone *)operator_new(0x6c0);
    EnvClone::EnvClone(pEVar1,(Environment *)
                              &perThreadEnv.
                               super__Vector_base<de::SharedPtr<vkt::api::(anonymous_namespace)::EnvClone>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::EnvClone>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,
                       (Parameters *)&sharedEnv.field_0x34,1);
    de::SharedPtr<vkt::api::(anonymous_namespace)::EnvClone>::SharedPtr(&local_108,pEVar1);
    pvVar2 = std::
             vector<de::SharedPtr<vkt::api::(anonymous_namespace)::EnvClone>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::EnvClone>_>_>
             ::operator[]((vector<de::SharedPtr<vkt::api::(anonymous_namespace)::EnvClone>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::EnvClone>_>_>
                           *)local_88,(ulong)local_f4);
    de::SharedPtr<vkt::api::(anonymous_namespace)::EnvClone>::operator=(pvVar2,&local_108);
    de::SharedPtr<vkt::api::(anonymous_namespace)::EnvClone>::~SharedPtr(&local_108);
    pRVar3 = (Resources *)operator_new(1);
    pvVar2 = std::
             vector<de::SharedPtr<vkt::api::(anonymous_namespace)::EnvClone>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::EnvClone>_>_>
             ::operator[]((vector<de::SharedPtr<vkt::api::(anonymous_namespace)::EnvClone>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::EnvClone>_>_>
                           *)local_88,(ulong)local_f4);
    pEVar1 = de::SharedPtr<vkt::api::(anonymous_namespace)::EnvClone>::operator->(pvVar2);
    Buffer::Resources::Resources(pRVar3,&pEVar1->env,(Parameters *)&context_local);
    de::SharedPtr<vkt::api::(anonymous_namespace)::Buffer::Resources>::SharedPtr(&local_118,pRVar3);
    pvVar4 = std::
             vector<de::SharedPtr<vkt::api::(anonymous_namespace)::Buffer::Resources>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::Buffer::Resources>_>_>
             ::operator[]((vector<de::SharedPtr<vkt::api::(anonymous_namespace)::Buffer::Resources>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::Buffer::Resources>_>_>
                           *)local_b8,(ulong)local_f4);
    de::SharedPtr<vkt::api::(anonymous_namespace)::Buffer::Resources>::operator=(pvVar4,&local_118);
    de::SharedPtr<vkt::api::(anonymous_namespace)::Buffer::Resources>::~SharedPtr(&local_118);
    this_00 = (CreateThread<vkt::api::(anonymous_namespace)::Buffer> *)operator_new(0x88);
    pvVar2 = std::
             vector<de::SharedPtr<vkt::api::(anonymous_namespace)::EnvClone>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::EnvClone>_>_>
             ::operator[]((vector<de::SharedPtr<vkt::api::(anonymous_namespace)::EnvClone>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::EnvClone>_>_>
                           *)local_88,(ulong)local_f4);
    pEVar1 = de::SharedPtr<vkt::api::(anonymous_namespace)::EnvClone>::operator->(pvVar2);
    pvVar4 = std::
             vector<de::SharedPtr<vkt::api::(anonymous_namespace)::Buffer::Resources>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::Buffer::Resources>_>_>
             ::operator[]((vector<de::SharedPtr<vkt::api::(anonymous_namespace)::Buffer::Resources>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::Buffer::Resources>_>_>
                           *)local_b8,(ulong)local_f4);
    pRVar3 = de::SharedPtr<vkt::api::(anonymous_namespace)::Buffer::Resources>::operator*(pvVar4);
    CreateThread<vkt::api::(anonymous_namespace)::Buffer>::CreateThread
              (this_00,&pEVar1->env,pRVar3,(Parameters *)&context_local);
    de::DefaultDeleter<vkt::api::(anonymous_namespace)::ThreadGroupThread>::DefaultDeleter
              (&local_129);
    de::details::
    MovePtr<vkt::api::(anonymous_namespace)::ThreadGroupThread,_de::DefaultDeleter<vkt::api::(anonymous_namespace)::ThreadGroupThread>_>
    ::MovePtr(&local_128,this_00);
    ThreadGroup::add((ThreadGroup *)local_f0,&local_128);
    de::details::
    MovePtr<vkt::api::(anonymous_namespace)::ThreadGroupThread,_de::DefaultDeleter<vkt::api::(anonymous_namespace)::ThreadGroupThread>_>
    ::~MovePtr(&local_128);
  }
  ThreadGroup::run(__return_storage_ptr__,(ThreadGroup *)local_f0);
  ThreadGroup::~ThreadGroup((ThreadGroup *)local_f0);
  std::
  vector<de::SharedPtr<vkt::api::(anonymous_namespace)::Buffer::Resources>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::Buffer::Resources>_>_>
  ::~vector((vector<de::SharedPtr<vkt::api::(anonymous_namespace)::Buffer::Resources>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::Buffer::Resources>_>_>
             *)local_b8);
  std::
  vector<de::SharedPtr<vkt::api::(anonymous_namespace)::EnvClone>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::EnvClone>_>_>
  ::~vector((vector<de::SharedPtr<vkt::api::(anonymous_namespace)::EnvClone>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::EnvClone>_>_>
             *)local_88);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus multithreadedCreatePerThreadDeviceTest (Context& context, typename Object::Parameters params)
{
	typedef SharedPtr<EnvClone>						EnvPtr;
	typedef SharedPtr<typename Object::Resources>	ResPtr;

	const deUint32				numThreads		= getDefaultTestThreadCount();
	const Device::Parameters	deviceParams	= getDefaulDeviceParameters(context);
	const Environment			sharedEnv		(context, numThreads);			// For creating Device's
	vector<EnvPtr>				perThreadEnv	(numThreads);
	vector<ResPtr>				resources		(numThreads);
	ThreadGroup					threads;

	for (deUint32 ndx = 0; ndx < numThreads; ndx++)
	{
		perThreadEnv[ndx]	= EnvPtr(new EnvClone(sharedEnv, deviceParams, 1u));
		resources[ndx]		= ResPtr(new typename Object::Resources(perThreadEnv[ndx]->env, params));

		threads.add(MovePtr<ThreadGroupThread>(new CreateThread<Object>(perThreadEnv[ndx]->env, *resources[ndx], params)));
	}

	return threads.run();
}